

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O3

strbuf * ecdh_key_getkey_wrapper(ecdh_key *ek,ptrlen remoteKey)

{
  _Bool _Var1;
  strbuf *buf_o;
  
  buf_o = strbuf_new();
  _Var1 = (*ek->vt->getkey)(ek,remoteKey,buf_o->binarysink_);
  if (!_Var1) {
    strbuf_free(buf_o);
    buf_o = (strbuf *)0x0;
  }
  return buf_o;
}

Assistant:

strbuf *ecdh_key_getkey_wrapper(ecdh_key *ek, ptrlen remoteKey)
{
    /* Fold the boolean return value in C into the string return value
     * for this purpose, by returning NULL on failure */
    strbuf *sb = strbuf_new();
    if (!ecdh_key_getkey(ek, remoteKey, BinarySink_UPCAST(sb))) {
        strbuf_free(sb);
        return NULL;
    }
    return sb;
}